

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_metric(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  REF_STATUS RVar5;
  FILE *__s;
  void *pvVar6;
  undefined8 *puVar7;
  size_t sVar8;
  long lVar9;
  undefined8 uVar10;
  size_t sVar11;
  ulong uVar12;
  char *pcVar13;
  REF_MPI pRVar14;
  ulong uVar15;
  REF_STATUS ref_private_macro_code_rxs;
  long lVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  REF_INT keyword_code;
  REF_BOOL met_format;
  REF_BOOL solb_format;
  REF_INT local;
  REF_INT code;
  uint local_b0 [2];
  void *local_a8;
  REF_MPI local_a0;
  REF_NODE local_98;
  REF_BOOL local_90;
  REF_BOOL local_8c;
  size_t local_88;
  void *local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  uint local_60;
  int local_5c;
  long local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  undefined4 local_34;
  
  pRVar1 = ref_grid->node;
  local_8c = 0;
  local_90 = 0;
  uVar2 = ref_node_synchronize_globals(pRVar1);
  if (uVar2 != 0) {
    uVar12 = (ulong)uVar2;
    pcVar13 = "sync";
    uVar10 = 0xbac;
    goto LAB_00178c26;
  }
  if (ref_grid->mpi->id == 0) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xbb2,"ref_gather_metric","unable to open file");
      return 2;
    }
    sVar11 = strlen(filename);
    if (sVar11 < 6) {
      if (sVar11 != 5) goto LAB_00177e98;
    }
    else {
      iVar3 = strcmp(filename + (sVar11 - 5),".solb");
      if (iVar3 == 0) {
        local_8c = 1;
      }
    }
    iVar3 = strcmp(filename + (sVar11 - 4),".met");
    if (iVar3 == 0) {
      local_90 = 1;
    }
  }
  else {
    __s = (FILE *)0x0;
  }
LAB_00177e98:
  uVar2 = ref_mpi_all_or(ref_grid->mpi,&local_8c);
  if (uVar2 != 0) {
    uVar12 = (ulong)uVar2;
    pcVar13 = "bcast";
    uVar10 = 0xbba;
    goto LAB_00178c26;
  }
  uVar2 = ref_mpi_all_or(ref_grid->mpi,&local_90);
  if (uVar2 != 0) {
    uVar12 = (ulong)uVar2;
    pcVar13 = "bcast";
    uVar10 = 0xbbb;
    goto LAB_00178c26;
  }
  if (local_8c == 0) {
    if (local_90 == 0) {
      uVar2 = ref_gather_node_metric(pRVar1,(FILE *)__s);
      if (uVar2 == 0) goto LAB_001787ff;
      uVar12 = (ulong)uVar2;
      pcVar13 = "nodes";
      uVar10 = 0xbc2;
      goto LAB_00178c26;
    }
    uVar2 = ref_gather_node_bamg_met(ref_grid,(FILE *)__s);
    if (uVar2 != 0) {
      uVar12 = (ulong)uVar2;
      pcVar13 = "nodes";
      uVar10 = 0xbc0;
      goto LAB_00178c26;
    }
    goto LAB_001787ff;
  }
  pRVar14 = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  uVar2 = ref_node_synchronize_globals(pRVar1);
  if (uVar2 != 0) {
    uVar12 = (ulong)uVar2;
    pcVar13 = "sync";
    uVar10 = 0x586;
    goto LAB_00177fe6;
  }
  bVar19 = ref_grid->twod == 0;
  lVar16 = 0x18;
  if (bVar19) {
    lVar16 = 0x30;
  }
  local_74 = bVar19 | 2;
  local_b0[0] = 2;
  uVar2 = ref_grid->meshb_version;
  if ((int)uVar2 < 2) {
    if (pRVar1->old_n_global < 0x989681) {
      pvVar6 = (void *)0x8;
      bVar19 = true;
    }
    else {
      bVar19 = (ulong)pRVar1->old_n_global < 0xbebc201;
      local_b0[0] = 4 - bVar19;
      pvVar6 = (void *)0xc;
    }
  }
  else {
    bVar19 = uVar2 < 4;
    pvVar6 = (void *)(ulong)((uint)(uVar2 != 2) * 4 + 8);
    local_b0[0] = uVar2;
  }
  local_98 = pRVar1;
  if (pRVar14->id != 0) {
    sVar11 = 0;
    uVar2 = local_b0[0];
    goto LAB_00178144;
  }
  local_34 = 1;
  local_a8 = pvVar6;
  sVar8 = fwrite(&local_34,4,1,__s);
  if (sVar8 == 1) {
    sVar8 = fwrite(local_b0,4,1,__s);
    if (sVar8 != 1) {
      pcVar13 = "version";
      sVar11 = 1;
      uVar10 = 0x5a0;
      goto LAB_00178bf9;
    }
    lVar18 = ftell(__s);
    local_b0[1] = 3;
    sVar8 = fwrite(local_b0 + 1,4,1,__s);
    uVar2 = local_b0[0];
    if (sVar8 != 1) {
      pcVar13 = "dim code";
      sVar11 = 1;
      uVar10 = 0x5a3;
      goto LAB_00178bf9;
    }
    local_88 = ((ulong)local_a8 & 0xffffffff) + lVar18 + 4;
    uVar4 = ref_export_meshb_next_position((FILE *)__s,local_b0[0],local_88);
    if (uVar4 != 0) {
      uVar12 = (ulong)uVar4;
      pcVar13 = "next p";
      uVar10 = 0x5a4;
      goto LAB_00177fe6;
    }
    sVar8 = fwrite(&local_74,4,1,__s);
    if (sVar8 != 1) {
      pcVar13 = "dim";
      sVar11 = 1;
      uVar10 = 0x5a5;
      goto LAB_00178bf9;
    }
    sVar8 = ftell(__s);
    if (local_88 != sVar8) {
      pcVar13 = "dim inconsistent";
      uVar10 = 0x5a6;
      sVar11 = local_88;
      goto LAB_00178bf9;
    }
    sVar11 = local_88;
    local_a0 = pRVar14;
    if (pRVar14->id != 0) {
LAB_00178144:
      lVar16 = local_98->old_n_global;
      uVar4 = (int)(lVar16 / (long)pRVar14->n) + 1;
      uVar12 = 0x7fffffff;
      if (0 < pRVar14->reduce_byte_limit) {
        uVar12 = (ulong)((uint)pRVar14->reduce_byte_limit >> 3) / 7;
      }
      if (((int)uVar12 <= (int)uVar4) || (uVar12 = (ulong)uVar4, -1 < (int)uVar4)) {
        uVar4 = (int)uVar12 * 7;
        local_a0 = pRVar14;
        local_88 = sVar11;
        local_50 = uVar12;
        pvVar6 = malloc((ulong)uVar4 * 8);
        if (pvVar6 == (void *)0x0) {
          pcVar13 = "malloc local_xyzm of REF_DBL NULL";
          uVar10 = 0x5bd;
        }
        else {
          local_a8 = pvVar6;
          pvVar6 = malloc((ulong)uVar4 * 8);
          if (pvVar6 != (void *)0x0) {
            local_80 = pvVar6;
            if (0 < lVar16) {
              local_48 = local_50 & 0xffffffff;
              local_60 = local_74;
              local_40 = (ulong)(uVar4 + (uVar4 == 0)) << 3;
              uVar12 = 0;
              lVar18 = 0;
              do {
                uVar15 = lVar16 - lVar18;
                if ((long)local_48 < lVar16 - lVar18) {
                  uVar15 = local_50;
                }
                uVar17 = uVar15 & 0xffffffff;
                if ((int)local_50 != 0) {
                  memset(local_a8,0,local_40);
                }
                local_70 = uVar17;
                local_58 = lVar18;
                if (0 < (int)uVar15) {
                  local_68 = uVar17 * 0x38;
                  uVar15 = 0;
                  do {
                    uVar4 = ref_node_local(local_98,lVar18,&local_5c);
                    if ((uVar4 != 0) && (uVar4 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x5ce,"ref_gather_node_metric_solb",(ulong)uVar4,"node local failed");
                      uVar12 = (ulong)uVar4;
                    }
                    pvVar6 = local_a8;
                    if (uVar4 == 5) {
LAB_0017830b:
                      puVar7 = (undefined8 *)((uVar15 & 0x7fffffff8) + (long)local_a8);
                      puVar7[4] = 0;
                      puVar7[5] = 0;
                      puVar7[2] = 0;
                      puVar7[3] = 0;
                      *puVar7 = 0;
                      puVar7[1] = 0;
                      puVar7[6] = 0;
                    }
                    else {
                      if (uVar4 != 0) {
                        if ((int)uVar12 == 0) goto LAB_001787ff;
                        goto LAB_00178c05;
                      }
                      if (local_a0->id != local_98->part[local_5c]) goto LAB_0017830b;
                      uVar4 = ref_node_metric_get(local_98,local_5c,
                                                  (REF_DBL *)(uVar15 + (long)local_a8));
                      if (uVar4 != 0) {
                        pcVar13 = "get";
                        uVar10 = 0x5d1;
                        uVar12 = (ulong)uVar4;
                        goto LAB_00177fe6;
                      }
                      *(undefined8 *)((long)pvVar6 + uVar15 + 0x30) = 0x3ff0000000000000;
                    }
                    uVar15 = uVar15 + 0x38;
                    lVar18 = lVar18 + 1;
                  } while (local_68 != uVar15);
                }
                iVar3 = (int)local_70;
                uVar4 = ref_mpi_sum(local_a0,local_a8,local_80,iVar3 * 7,3);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5d8,"ref_gather_node_metric_solb",(ulong)uVar4,"sum");
                  uVar12 = (ulong)uVar4;
                  goto LAB_00178c05;
                }
                if ((0 < iVar3) && (local_a0->id == 0)) {
                  local_68 = (local_70 & 0xffffffff) * 0x38;
                  uVar15 = 0;
                  lVar16 = local_58;
                  do {
                    dVar20 = *(double *)((long)local_80 + uVar15 + 0x30) + -1.0;
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    if (0.1 < dVar20) {
                      printf("error gather node %ld %f\n",lVar16);
                    }
                    sVar8 = fwrite((void *)((long)local_80 + uVar15),8,1,__s);
                    pvVar6 = local_80;
                    if (local_60 == 3) {
                      if (sVar8 != 1) {
                        pcVar13 = "m11";
                        uVar10 = 0x5e1;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)local_80 + uVar15 + 8),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m12";
                        uVar10 = 0x5e2;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)pvVar6 + uVar15 + 0x18),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m22";
                        uVar10 = 0x5e4;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)pvVar6 + uVar15 + 0x10),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m13";
                        uVar10 = 0x5e5;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)pvVar6 + uVar15 + 0x20),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m23";
                        uVar10 = 0x5e6;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)pvVar6 + uVar15 + 0x28),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m33";
                        uVar10 = 0x5e7;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                    }
                    else {
                      if (sVar8 != 1) {
                        pcVar13 = "m11";
                        uVar10 = 0x5e9;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)local_80 + uVar15 + 8),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m12";
                        uVar10 = 0x5ea;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                      sVar8 = fwrite((void *)((long)pvVar6 + uVar15 + 0x18),8,1,__s);
                      if (sVar8 != 1) {
                        pcVar13 = "m22";
                        uVar10 = 0x5eb;
                        sVar11 = 1;
                        goto LAB_00178bf9;
                      }
                    }
                    lVar16 = lVar16 + 1;
                    uVar15 = uVar15 + 0x38;
                  } while (local_68 != uVar15);
                }
                lVar18 = local_58 + (int)local_70;
                lVar16 = local_98->old_n_global;
              } while (lVar18 < lVar16);
            }
            sVar11 = local_88;
            free(local_80);
            free(local_a8);
            pRVar14 = local_a0;
            if (local_a0->id != 0) {
LAB_001787ff:
              if (ref_grid->mpi->id != 0) {
                return 0;
              }
              fclose(__s);
              return 0;
            }
            sVar8 = ftell(__s);
            if (sVar11 == sVar8) {
              if (pRVar14->id != 0) goto LAB_001787ff;
              local_b0[1] = 0x36;
              sVar8 = fwrite(local_b0 + 1,4,1,__s);
              if (sVar8 == 1) {
                uVar2 = ref_export_meshb_next_position((FILE *)__s,uVar2,0);
                if (uVar2 == 0) goto LAB_001787ff;
                uVar12 = (ulong)uVar2;
                pcVar13 = "next p";
                uVar10 = 0x5fa;
                goto LAB_00177fe6;
              }
              pcVar13 = "end kw";
              uVar10 = 0x5f8;
              sVar11 = 1;
            }
            else {
              pcVar13 = "solb metric record len inconsistent";
              uVar10 = 0x5f4;
            }
            goto LAB_00178bf9;
          }
          pcVar13 = "malloc xyzm of REF_DBL NULL";
          uVar10 = 0x5be;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar10,"ref_gather_node_metric_solb",pcVar13);
        uVar12 = 2;
        goto LAB_00178c05;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x5bd,"ref_gather_node_metric_solb","malloc local_xyzm of REF_DBL negative");
      goto LAB_00178c00;
    }
    lVar18 = local_98->old_n_global;
    lVar9 = ftell(__s);
    local_b0[1] = 0x3e;
    sVar8 = fwrite(local_b0 + 1,4,1,__s);
    if (sVar8 != 1) {
      pcVar13 = "vertex version code";
      uVar10 = 0x5af;
      sVar11 = 1;
      goto LAB_00178bf9;
    }
    sVar11 = (ulong)((int)local_a8 + (uint)(bVar19 ^ 1) * 4) + lVar16 * lVar18 + lVar9 + 0xc;
    uVar4 = ref_export_meshb_next_position((FILE *)__s,uVar2,sVar11);
    if (uVar4 == 0) {
      RVar5 = ref_gather_meshb_glob((FILE *)__s,uVar2,local_98->old_n_global);
      if (RVar5 == 0) {
        local_b0[1] = 1;
        sVar8 = fwrite(local_b0 + 1,4,1,__s);
        if (sVar8 == 1) {
          local_b0[1] = 3;
          sVar8 = fwrite(local_b0 + 1,4,1,__s);
          pRVar14 = local_a0;
          if (sVar8 == 1) goto LAB_00178144;
          pcVar13 = "metric solution";
          uVar10 = 0x5b6;
          sVar11 = 1;
        }
        else {
          pcVar13 = "n solutions";
          uVar10 = 0x5b4;
          sVar11 = 1;
        }
        goto LAB_00178bf9;
      }
      pcVar13 = "nnode";
      uVar10 = 0x5b2;
      uVar12 = 1;
    }
    else {
      uVar12 = (ulong)uVar4;
      pcVar13 = "next p";
      uVar10 = 0x5b0;
    }
LAB_00177fe6:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar10
           ,"ref_gather_node_metric_solb",uVar12,pcVar13);
  }
  else {
    pcVar13 = "code";
    sVar11 = 1;
    uVar10 = 0x59f;
LAB_00178bf9:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar10
           ,"ref_gather_node_metric_solb",pcVar13,sVar11,sVar8);
LAB_00178c00:
    uVar12 = 1;
  }
LAB_00178c05:
  pcVar13 = "nodes";
  uVar10 = 0xbbe;
LAB_00178c26:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar10,
         "ref_gather_metric",uVar12,pcVar13);
  return (REF_STATUS)uVar12;
}

Assistant:

REF_FCN REF_STATUS ref_gather_metric(REF_GRID ref_grid, const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL met_format = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
    if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".met") == 0)
      met_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &solb_format), "bcast");
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &met_format), "bcast");

  if (solb_format) {
    RSS(ref_gather_node_metric_solb(ref_grid, file), "nodes");
  } else if (met_format) {
    RSS(ref_gather_node_bamg_met(ref_grid, file), "nodes");
  } else {
    RSS(ref_gather_node_metric(ref_node, file), "nodes");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}